

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

s32 __thiscall
irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles
          (CNullDriver *this,path *vertexShaderProgramFileName,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,path *pixelShaderProgramFileName,
          c8 *pixelShaderEntryPointName,E_PIXEL_SHADER_TYPE psCompileTarget,
          path *geometryShaderProgramFileName,c8 *geometryShaderEntryPointName,
          E_GEOMETRY_SHADER_TYPE gsCompileTarget,E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,
          u32 verticesOut,IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,
          s32 userData)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  double __x;
  double __x_00;
  double __x_01;
  
  if ((int)(vertexShaderProgramFileName->str)._M_string_length == 0) {
LAB_001ce8f4:
    plVar4 = (long *)0x0;
  }
  else {
    iVar3 = (**this->FileSystem->_vptr_IFileSystem)();
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 == (long *)0x0) {
      os::Printer::log(__x);
      goto LAB_001ce8f4;
    }
  }
  if ((int)(pixelShaderProgramFileName->str)._M_string_length == 0) {
LAB_001ce92e:
    plVar5 = (long *)0x0;
  }
  else {
    iVar3 = (**this->FileSystem->_vptr_IFileSystem)(this->FileSystem,pixelShaderProgramFileName);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (plVar5 == (long *)0x0) {
      os::Printer::log(__x_00);
      goto LAB_001ce92e;
    }
  }
  if ((int)(geometryShaderProgramFileName->str)._M_string_length != 0) {
    iVar3 = (**this->FileSystem->_vptr_IFileSystem)(this->FileSystem,geometryShaderProgramFileName);
    plVar6 = (long *)CONCAT44(extraout_var_01,iVar3);
    if (plVar6 != (long *)0x0) goto LAB_001ce985;
    os::Printer::log(__x_01);
  }
  plVar6 = (long *)0x0;
LAB_001ce985:
  iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x73])
                    (this,plVar4,vertexShaderEntryPointName,(ulong)vsCompileTarget,plVar5,
                     pixelShaderEntryPointName,(ulong)psCompileTarget,plVar6,
                     geometryShaderEntryPointName,(ulong)gsCompileTarget,(ulong)inType,
                     (ulong)outType,(ulong)verticesOut,callback,(ulong)baseMaterial,
                     (ulong)(uint)userData);
  if (plVar5 != (long *)0x0) {
    lVar2 = *(long *)(*plVar5 + -0x18);
    piVar1 = (int *)((long)plVar5 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar5 = (long *)((long)plVar5 + lVar2);
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  if (plVar4 != (long *)0x0) {
    lVar2 = *(long *)(*plVar4 + -0x18);
    piVar1 = (int *)((long)plVar4 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar4 = (long *)((long)plVar4 + lVar2);
      (**(code **)(*plVar4 + 8))(plVar4);
    }
  }
  if (plVar6 != (long *)0x0) {
    lVar2 = *(long *)(*plVar6 + -0x18);
    piVar1 = (int *)((long)plVar6 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar6 = (long *)((long)plVar6 + lVar2);
      (**(code **)(*plVar6 + 8))(plVar6);
    }
  }
  return iVar3;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		const io::path &vertexShaderProgramFileName,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const io::path &pixelShaderProgramFileName,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const io::path &geometryShaderProgramFileName,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	io::IReadFile *vsfile = 0;
	io::IReadFile *psfile = 0;
	io::IReadFile *gsfile = 0;

	if (vertexShaderProgramFileName.size()) {
		vsfile = FileSystem->createAndOpenFile(vertexShaderProgramFileName);
		if (!vsfile) {
			os::Printer::log("Could not open vertex shader program file",
					vertexShaderProgramFileName, ELL_WARNING);
		}
	}

	if (pixelShaderProgramFileName.size()) {
		psfile = FileSystem->createAndOpenFile(pixelShaderProgramFileName);
		if (!psfile) {
			os::Printer::log("Could not open pixel shader program file",
					pixelShaderProgramFileName, ELL_WARNING);
		}
	}

	if (geometryShaderProgramFileName.size()) {
		gsfile = FileSystem->createAndOpenFile(geometryShaderProgramFileName);
		if (!gsfile) {
			os::Printer::log("Could not open geometry shader program file",
					geometryShaderProgramFileName, ELL_WARNING);
		}
	}

	s32 result = addHighLevelShaderMaterialFromFiles(
			vsfile, vertexShaderEntryPointName, vsCompileTarget,
			psfile, pixelShaderEntryPointName, psCompileTarget,
			gsfile, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	if (psfile)
		psfile->drop();

	if (vsfile)
		vsfile->drop();

	if (gsfile)
		gsfile->drop();

	return result;
}